

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

BasicType __thiscall
wasm::Random::pick<wasm::Type::BasicType>
          (Random *this,FeatureOptions<wasm::Type::BasicType> *picker)

{
  BasicType BVar1;
  value_type *pvVar2;
  vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> local_30;
  
  items<wasm::Type::BasicType>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>>
                     (this,&local_30);
  BVar1 = *pvVar2;
  if (local_30.super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }